

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O0

int gc_color(lua_State *L)

{
  StkId pTVar1;
  GCObject *pGVar2;
  char *local_38;
  char *local_30;
  GCObject *obj;
  TValue *o;
  lua_State *L_local;
  
  luaL_checkany(L,1);
  pTVar1 = L->ci->func;
  if ((pTVar1[1].tt_ & 0x8000) == 0) {
    lua_pushstring(L,"no collectable");
  }
  else {
    if ((pTVar1[1].tt_ & 0x8000) == 0) {
      __assert_fail("(((o)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0x2e1,"int gc_color(lua_State *)");
    }
    pGVar2 = pTVar1[1].value_.gc;
    if ((pGVar2->marked & (L->l_G->currentwhite ^ 0x18)) == 0) {
      if ((pGVar2->marked & 0x18) == 0) {
        local_38 = "gray";
        if ((pGVar2->marked & 0x20) != 0) {
          local_38 = "black";
        }
      }
      else {
        local_38 = "white";
      }
      local_30 = local_38;
    }
    else {
      local_30 = "dead";
    }
    lua_pushstring(L,local_30);
  }
  return 1;
}

Assistant:

static int gc_color (lua_State *L) {
  TValue *o;
  luaL_checkany(L, 1);
  o = obj_at(L, 1);
  if (!iscollectable(o))
    lua_pushstring(L, "no collectable");
  else {
    GCObject *obj = gcvalue(o);
    lua_pushstring(L, isdead(G(L), obj) ? "dead" :
                      iswhite(obj) ? "white" :
                      isblack(obj) ? "black" : "gray");
  }
  return 1;
}